

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void TestPageMap(void)

{
  bool bVar1;
  PageMap *this;
  void *pvVar2;
  PageMap *pm;
  
  printf("===================== TestPageMap BEGIN =====================\n");
  this = (PageMap *)operator_new(0x2000040);
  tcmalloc::PageMap::PageMap(this);
  bVar1 = tcmalloc::PageMap::Set(this,1,(void *)0x2);
  if (!bVar1) {
    __assert_fail("pm->Set(0x1, (void*)2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x70,"void TestPageMap()");
  }
  bVar1 = tcmalloc::PageMap::Set(this,2,(void *)0x2);
  if (!bVar1) {
    __assert_fail("pm->Set(0x2, (void*)2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x71,"void TestPageMap()");
  }
  bVar1 = tcmalloc::PageMap::Set(this,2,(void *)0x3);
  if (!bVar1) {
    __assert_fail("pm->Set(0x2, (void*)3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x72,"void TestPageMap()");
  }
  pvVar2 = tcmalloc::PageMap::Get(this,1);
  if (pvVar2 != (void *)0x2) {
    __assert_fail("pm->Get(0x1) == (void*)2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x73,"void TestPageMap()");
  }
  pvVar2 = tcmalloc::PageMap::Get(this,3);
  if (pvVar2 != (void *)0x0) {
    __assert_fail("pm->Get(0x3) == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x74,"void TestPageMap()");
  }
  bVar1 = tcmalloc::PageMap::Set(this,0xf00fff0,(void *)0x2);
  if (!bVar1) {
    __assert_fail("pm->Set(0x0f00fff0, (void*)2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x76,"void TestPageMap()");
  }
  bVar1 = tcmalloc::PageMap::Set(this,0xf00fff1,(void *)0x2);
  if (!bVar1) {
    __assert_fail("pm->Set(0x0f00fff1, (void*)2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x77,"void TestPageMap()");
  }
  bVar1 = tcmalloc::PageMap::Set(this,0xff00fff0,(void *)0x3);
  if (!bVar1) {
    __assert_fail("pm->Set(0xff00fff0, (void*)3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x78,"void TestPageMap()");
  }
  pvVar2 = tcmalloc::PageMap::Get(this,0xf00fff1);
  if (pvVar2 != (void *)0x2) {
    __assert_fail("pm->Get(0x0f00fff1) == (void*)2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x79,"void TestPageMap()");
  }
  pvVar2 = tcmalloc::PageMap::Get(this,0xff00fff0);
  if (pvVar2 != (void *)0x3) {
    __assert_fail("pm->Get(0xff00fff0) == (void*)3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x7a,"void TestPageMap()");
  }
  pvVar2 = tcmalloc::PageMap::Get(this,0x8f00fff0);
  if (pvVar2 != (void *)0x0) {
    __assert_fail("pm->Get(0x8f00fff0) == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x7b,"void TestPageMap()");
  }
  bVar1 = tcmalloc::PageMap::Set(this,0xfff100000f00fff0,(void *)0x2);
  if (!bVar1) {
    __assert_fail("pm->Set(0xfff100000f00fff0, (void*)2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x7d,"void TestPageMap()");
  }
  bVar1 = tcmalloc::PageMap::Set(this,0xfff200000f00fff1,(void *)0x2);
  if (!bVar1) {
    __assert_fail("pm->Set(0xfff200000f00fff1, (void*)2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x7e,"void TestPageMap()");
  }
  bVar1 = tcmalloc::PageMap::Set(this,0xfff30000ff00fff0,(void *)0x3);
  if (!bVar1) {
    __assert_fail("pm->Set(0xfff30000ff00fff0, (void*)3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x7f,"void TestPageMap()");
  }
  pvVar2 = tcmalloc::PageMap::Get(this,0xfff200000f00fff1);
  if (pvVar2 != (void *)0x2) {
    __assert_fail("pm->Get(0xfff200000f00fff1) == (void*)2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x80,"void TestPageMap()");
  }
  pvVar2 = tcmalloc::PageMap::Get(this,0xfff30000ff00fff0);
  if (pvVar2 == (void *)0x3) {
    pvVar2 = tcmalloc::PageMap::Get(this,0xffff00008f00fff0);
    if (pvVar2 == (void *)0x0) {
      if (this != (PageMap *)0x0) {
        operator_delete(this,0x2000040);
      }
      printf("===================== TestPageMap PASS =====================\n");
      return;
    }
    __assert_fail("pm->Get(0xffff00008f00fff0) == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x82,"void TestPageMap()");
  }
  __assert_fail("pm->Get(0xfff30000ff00fff0) == (void*)3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                ,0x81,"void TestPageMap()");
}

Assistant:

void TestPageMap() {
    printf("===================== TestPageMap BEGIN =====================\n");
    auto* pm = new tcmalloc::PageMap();
    assert(pm->Set(0x1, (void*)2));
    assert(pm->Set(0x2, (void*)2));
    assert(pm->Set(0x2, (void*)3));
    assert(pm->Get(0x1) == (void*)2);
    assert(pm->Get(0x3) == nullptr);

    assert(pm->Set(0x0f00fff0, (void*)2));
    assert(pm->Set(0x0f00fff1, (void*)2));
    assert(pm->Set(0xff00fff0, (void*)3));
    assert(pm->Get(0x0f00fff1) == (void*)2);
    assert(pm->Get(0xff00fff0) == (void*)3);
    assert(pm->Get(0x8f00fff0) == nullptr);

    assert(pm->Set(0xfff100000f00fff0, (void*)2));
    assert(pm->Set(0xfff200000f00fff1, (void*)2));
    assert(pm->Set(0xfff30000ff00fff0, (void*)3));
    assert(pm->Get(0xfff200000f00fff1) == (void*)2);
    assert(pm->Get(0xfff30000ff00fff0) == (void*)3);
    assert(pm->Get(0xffff00008f00fff0) == nullptr);
    delete pm;
    printf("===================== TestPageMap PASS =====================\n");
}